

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_tls.c
# Opt level: O3

void mbedtls_ssl_handshake_free(mbedtls_ssl_handshake_params *handshake)

{
  size_t sVar1;
  mbedtls_ssl_key_cert *pmVar2;
  mbedtls_ssl_key_cert *__ptr;
  long lVar3;
  size_t sVar4;
  uchar *__ptr_00;
  
  if (handshake != (mbedtls_ssl_handshake_params *)0x0) {
    mbedtls_md5_free(&handshake->fin_md5);
    mbedtls_sha1_free(&handshake->fin_sha1);
    mbedtls_sha256_free(&handshake->fin_sha256);
    mbedtls_sha512_free(&handshake->fin_sha512);
    mbedtls_dhm_free(&handshake->dhm_ctx);
    mbedtls_ecdh_free(&handshake->ecdh_ctx);
    free(handshake->curves);
    __ptr_00 = handshake->psk;
    if (__ptr_00 != (uchar *)0x0) {
      sVar1 = handshake->psk_len;
      if (sVar1 != 0) {
        sVar4 = 0;
        do {
          __ptr_00[sVar4] = '\0';
          sVar4 = sVar4 + 1;
        } while (sVar1 != sVar4);
        __ptr_00 = handshake->psk;
      }
      free(__ptr_00);
    }
    __ptr = handshake->sni_key_cert;
    while (__ptr != (mbedtls_ssl_key_cert *)0x0) {
      pmVar2 = __ptr->next;
      free(__ptr);
      __ptr = pmVar2;
    }
    free(handshake->verify_cookie);
    free(handshake->hs_msg);
    ssl_flight_free(handshake->flight);
    lVar3 = 0;
    do {
      *(undefined1 *)((long)&handshake->sig_alg + lVar3) = 0;
      lVar3 = lVar3 + 1;
    } while (lVar3 != 0xa98);
  }
  return;
}

Assistant:

void mbedtls_ssl_handshake_free( mbedtls_ssl_handshake_params *handshake )
{
    if( handshake == NULL )
        return;

#if defined(MBEDTLS_SSL_PROTO_SSL3) || defined(MBEDTLS_SSL_PROTO_TLS1) || \
    defined(MBEDTLS_SSL_PROTO_TLS1_1)
    mbedtls_md5_free(    &handshake->fin_md5  );
    mbedtls_sha1_free(   &handshake->fin_sha1 );
#endif
#if defined(MBEDTLS_SSL_PROTO_TLS1_2)
#if defined(MBEDTLS_SHA256_C)
    mbedtls_sha256_free(   &handshake->fin_sha256    );
#endif
#if defined(MBEDTLS_SHA512_C)
    mbedtls_sha512_free(   &handshake->fin_sha512    );
#endif
#endif /* MBEDTLS_SSL_PROTO_TLS1_2 */

#if defined(MBEDTLS_DHM_C)
    mbedtls_dhm_free( &handshake->dhm_ctx );
#endif
#if defined(MBEDTLS_ECDH_C)
    mbedtls_ecdh_free( &handshake->ecdh_ctx );
#endif
#if defined(MBEDTLS_KEY_EXCHANGE_ECJPAKE_ENABLED)
    mbedtls_ecjpake_free( &handshake->ecjpake_ctx );
#if defined(MBEDTLS_SSL_CLI_C)
    mbedtls_free( handshake->ecjpake_cache );
    handshake->ecjpake_cache = NULL;
    handshake->ecjpake_cache_len = 0;
#endif
#endif

#if defined(MBEDTLS_ECDH_C) || defined(MBEDTLS_ECDSA_C) || \
    defined(MBEDTLS_KEY_EXCHANGE_ECJPAKE_ENABLED)
    /* explicit void pointer cast for buggy MS compiler */
    mbedtls_free( (void *) handshake->curves );
#endif

#if defined(MBEDTLS_KEY_EXCHANGE__SOME__PSK_ENABLED)
    if( handshake->psk != NULL )
    {
        mbedtls_zeroize( handshake->psk, handshake->psk_len );
        mbedtls_free( handshake->psk );
    }
#endif

#if defined(MBEDTLS_X509_CRT_PARSE_C) && \
    defined(MBEDTLS_SSL_SERVER_NAME_INDICATION)
    /*
     * Free only the linked list wrapper, not the keys themselves
     * since the belong to the SNI callback
     */
    if( handshake->sni_key_cert != NULL )
    {
        mbedtls_ssl_key_cert *cur = handshake->sni_key_cert, *next;

        while( cur != NULL )
        {
            next = cur->next;
            mbedtls_free( cur );
            cur = next;
        }
    }
#endif /* MBEDTLS_X509_CRT_PARSE_C && MBEDTLS_SSL_SERVER_NAME_INDICATION */

#if defined(MBEDTLS_SSL_PROTO_DTLS)
    mbedtls_free( handshake->verify_cookie );
    mbedtls_free( handshake->hs_msg );
    ssl_flight_free( handshake->flight );
#endif

    mbedtls_zeroize( handshake, sizeof( mbedtls_ssl_handshake_params ) );
}